

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

err_t rngESHealth2(void)

{
  err_t eVar1;
  size_t pos;
  char *sources [2];
  char *in_stack_000009a8;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    if (1 < local_20) {
      return 0x12f;
    }
    eVar1 = rngESTest(in_stack_000009a8);
    if (eVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

err_t rngESHealth2()
{
	const char* sources[] = { "trng", "trng2" };
	size_t pos;
	// проверить физические источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESTest(sources[pos]) == ERR_OK)
			return ERR_OK;
	// работоспособные источники не найдены
	return ERR_NOT_ENOUGH_ENTROPY;
}